

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O1

cgltf_result
cgltf_load_buffer_base64(cgltf_options *options,cgltf_size size,char *base64,void **out_data)

{
  char cVar1;
  int iVar2;
  uint uVar3;
  cgltf_result cVar4;
  void *pvVar5;
  _func_void_ptr_void_ptr_cgltf_size *p_Var6;
  _func_void_void_ptr_void_ptr *p_Var7;
  uint uVar8;
  uint uVar9;
  bool bVar10;
  ulong local_48;
  
  p_Var6 = cgltf_default_alloc;
  if (options->memory_alloc != (_func_void_ptr_void_ptr_cgltf_size *)0x0) {
    p_Var6 = options->memory_alloc;
  }
  p_Var7 = cgltf_default_free;
  if (options->memory_free != (_func_void_void_ptr_void_ptr *)0x0) {
    p_Var7 = options->memory_free;
  }
  pvVar5 = (*p_Var6)(options->memory_user_data,size);
  if (pvVar5 == (void *)0x0) {
    cVar4 = cgltf_result_out_of_memory;
  }
  else {
    bVar10 = size != 0;
    if (bVar10) {
      local_48 = 0;
      uVar8 = 0;
      uVar9 = 0;
      do {
        while (uVar8 < 8) {
          cVar1 = *base64;
          iVar2 = (int)cVar1;
          uVar3 = iVar2 - 0x41;
          if (0x19 < uVar3) {
            if (iVar2 - 0x61U < 0x1a) {
              uVar3 = iVar2 - 0x47;
            }
            else if (iVar2 - 0x30U < 10) {
              uVar3 = iVar2 + 4;
            }
            else {
              uVar3 = 0x3e;
              if (cVar1 != '+') {
                uVar3 = -(uint)(cVar1 != '/') | 0x3f;
              }
            }
          }
          if ((int)uVar3 < 0) {
            (*p_Var7)(options->memory_user_data,pvVar5);
          }
          else {
            uVar9 = uVar9 << 6 | uVar3;
            uVar8 = uVar8 + 6;
          }
          base64 = base64 + 1;
          if ((int)uVar3 < 0) {
            if (bVar10) {
              return cgltf_result_io_error;
            }
            goto LAB_0034ec9f;
          }
        }
        uVar8 = uVar8 - 8;
        *(char *)((long)pvVar5 + local_48) = (char)(uVar9 >> ((byte)uVar8 & 0x1f));
        local_48 = local_48 + 1;
        bVar10 = local_48 < size;
      } while (local_48 != size);
    }
LAB_0034ec9f:
    *out_data = pvVar5;
    cVar4 = cgltf_result_success;
  }
  return cVar4;
}

Assistant:

cgltf_result cgltf_load_buffer_base64(const cgltf_options* options, cgltf_size size, const char* base64, void** out_data)
{
    void* (*memory_alloc)(void*, cgltf_size) = options->memory_alloc ? options->memory_alloc : &cgltf_default_alloc;
    void (*memory_free)(void*, void*) = options->memory_free ? options->memory_free : &cgltf_default_free;

    unsigned char* data = (unsigned char*)memory_alloc(options->memory_user_data, size);
    if (!data)
    {
        return cgltf_result_out_of_memory;
    }

    unsigned int buffer = 0;
    unsigned int buffer_bits = 0;

    for (cgltf_size i = 0; i < size; ++i)
    {
        while (buffer_bits < 8)
        {
            char ch = *base64++;

            int index =
                (unsigned)(ch - 'A') < 26 ? (ch - 'A') :
                (unsigned)(ch - 'a') < 26 ? (ch - 'a') + 26 :
                (unsigned)(ch - '0') < 10 ? (ch - '0') + 52 :
                ch == '+' ? 62 :
                ch == '/' ? 63 :
                -1;

            if (index < 0)
            {
                memory_free(options->memory_user_data, data);
                return cgltf_result_io_error;
            }

            buffer = (buffer << 6) | index;
            buffer_bits += 6;
        }

        data[i] = (unsigned char)(buffer >> (buffer_bits - 8));
        buffer_bits -= 8;
    }

    *out_data = data;

    return cgltf_result_success;
}